

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createQuadMosaicCube(void)

{
  int iVar1;
  long lVar2;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *in_RDI;
  int (*paiVar3) [6];
  int vertexNdx;
  long lVar4;
  pointer pVVar5;
  VecAccess<float,_4,_3> local_48;
  
  if (createQuadMosaicCube()::texCoordsCube == '\0') {
    iVar1 = __cxa_guard_acquire(&createQuadMosaicCube()::texCoordsCube);
    if (iVar1 != 0) {
      createQuadMosaicCube::texCoordsCube[0].m_data[0] = -1.0;
      createQuadMosaicCube::texCoordsCube[0].m_data[1] = -1.0;
      createQuadMosaicCube::texCoordsCube[0].m_data[2] = -1.0;
      createQuadMosaicCube::texCoordsCube[1].m_data[0] = 1.0;
      createQuadMosaicCube::texCoordsCube[1].m_data[1] = -1.0;
      createQuadMosaicCube::texCoordsCube[1].m_data[2] = -1.0;
      createQuadMosaicCube::texCoordsCube[2].m_data[0] = 1.0;
      createQuadMosaicCube::texCoordsCube[2].m_data[1] = -1.0;
      createQuadMosaicCube::texCoordsCube[2].m_data[2] = 1.0;
      createQuadMosaicCube::texCoordsCube[3].m_data[0] = -1.0;
      createQuadMosaicCube::texCoordsCube[3].m_data[1] = -1.0;
      createQuadMosaicCube::texCoordsCube[3].m_data[2] = 1.0;
      createQuadMosaicCube::texCoordsCube[4].m_data[0] = -1.0;
      createQuadMosaicCube::texCoordsCube[4].m_data[1] = 1.0;
      createQuadMosaicCube::texCoordsCube[4].m_data[2] = -1.0;
      createQuadMosaicCube::texCoordsCube[5].m_data[0] = 1.0;
      createQuadMosaicCube::texCoordsCube[5].m_data[1] = 1.0;
      createQuadMosaicCube::texCoordsCube[5].m_data[2] = -1.0;
      createQuadMosaicCube::texCoordsCube[6].m_data[0] = 1.0;
      createQuadMosaicCube::texCoordsCube[6].m_data[1] = 1.0;
      createQuadMosaicCube::texCoordsCube[6].m_data[2] = 1.0;
      createQuadMosaicCube::texCoordsCube[7].m_data[0] = -1.0;
      createQuadMosaicCube::texCoordsCube[7].m_data[1] = 1.0;
      createQuadMosaicCube::texCoordsCube[7].m_data[2] = 1.0;
      __cxa_guard_release(&createQuadMosaicCube()::texCoordsCube);
    }
  }
  createQuadMosaic(in_RDI,2,3);
  pVVar5 = (in_RDI->
           super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paiVar3 = createQuadMosaicCube::texCoordCubeIndices;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      local_48.m_vector = &pVVar5->texCoord;
      local_48.m_index[0] = 0;
      local_48.m_index[1] = 1;
      local_48.m_index[2] = 2;
      tcu::VecAccess<float,_4,_3>::operator=
                (&local_48,createQuadMosaicCube::texCoordsCube + (*paiVar3)[lVar4]);
      pVVar5 = pVVar5 + 1;
    }
    paiVar3 = paiVar3 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<Vertex4Tex4> createQuadMosaicCube (void)
{
	using tcu::Vec3;

	static const Vec3 texCoordsCube[8] =
	{
		Vec3(-1.0f, -1.0f, -1.0f),	// 0: -X, -Y, -Z
		Vec3(1.0f, -1.0f, -1.0f),	// 1:  X, -Y, -Z
		Vec3(1.0f, -1.0f, 1.0f),	// 2:  X, -Y,  Z
		Vec3(-1.0f, -1.0f, 1.0f),	// 3: -X, -Y,  Z

		Vec3(-1.0f, 1.0f, -1.0f),	// 4: -X,  Y, -Z
		Vec3(1.0f, 1.0f, -1.0f),	// 5:  X,  Y, -Z
		Vec3(1.0f, 1.0f, 1.0f),		// 6:  X,  Y,  Z
		Vec3(-1.0f, 1.0f, 1.0f),	// 7: -X,  Y,  Z
	};

	static const int texCoordCubeIndices[6][6] =
	{
		{ 6, 5, 2, 2, 5, 1 },		// +X face
		{ 3, 0, 7, 7, 0, 4 },		// -X face
		{ 4, 5, 7, 7, 5, 6 },		// +Y face
		{ 3, 2, 0, 0, 2, 1 },		// -Y face
		{ 2, 3, 6, 6, 3, 7 },		// +Z face
		{ 0, 1, 4, 4, 1, 5 }		// -Z face
	};

	// Create 6 quads and set appropriate texture coordinates for cube mapping

	std::vector<Vertex4Tex4>			vertices	= createQuadMosaic(2, 3);
	std::vector<Vertex4Tex4>::iterator	vertexItr	= vertices.begin();

	for (int quadNdx = 0; quadNdx < 6; quadNdx++)
	{
		for (int vertexNdx = 0; vertexNdx < 6; vertexNdx++)
		{
			vertexItr->texCoord.xyz() = texCoordsCube[texCoordCubeIndices[quadNdx][vertexNdx]];
			vertexItr++;
		}
	}

	return vertices;
}